

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable
          (DebugInfoManager *this,Instruction *scope_and_line,uint32_t variable_id,uint32_t value_id
          ,Instruction *insert_pos)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  pointer ppVar4;
  reference ppIVar5;
  Instruction *pIVar6;
  Instruction *local_70;
  Instruction *insert_before;
  Instruction *dbg_decl_or_val;
  iterator __end2;
  iterator __begin2;
  set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  _Stack_40;
  bool modified;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_38;
  iterator dbg_decl_itr;
  Instruction *insert_pos_local;
  uint32_t value_id_local;
  uint32_t variable_id_local;
  Instruction *scope_and_line_local;
  DebugInfoManager *this_local;
  
  dbg_decl_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
               )insert_pos;
  insert_pos_local._0_4_ = value_id;
  insert_pos_local._4_4_ = variable_id;
  _value_id_local = scope_and_line;
  scope_and_line_local = (Instruction *)this;
  if (scope_and_line == (Instruction *)0x0) {
    __assert_fail("scope_and_line != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x235,
                  "bool spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable(Instruction *, uint32_t, uint32_t, Instruction *)"
                 );
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->var_id_to_dbg_decl_,(key_type *)((long)&insert_pos_local + 4));
  _Stack_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::end(&this->var_id_to_dbg_decl_);
  bVar1 = std::__detail::operator==(&local_38,&stack0xffffffffffffffc0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = false;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                           *)&local_38);
    __end2 = std::
             set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&ppVar4->second);
    dbg_decl_or_val =
         (Instruction *)
         std::
         set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&ppVar4->second);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&dbg_decl_or_val), this_local._7_1_ = bVar1,
          bVar2) {
      ppIVar5 = std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator*(&__end2);
      pIVar6 = *ppIVar5;
      local_70 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                           ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                            dbg_decl_itr.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                            ._M_cur);
      while( true ) {
        OVar3 = opt::Instruction::opcode(local_70);
        bVar2 = true;
        if (OVar3 != OpPhi) {
          OVar3 = opt::Instruction::opcode(local_70);
          bVar2 = OVar3 == OpVariable;
        }
        if (!bVar2) break;
        local_70 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                             (&local_70->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      }
      pIVar6 = AddDebugValueForDecl(this,pIVar6,(uint32_t)insert_pos_local,local_70,_value_id_local)
      ;
      bVar1 = bVar1 != false || pIVar6 != (Instruction *)0x0;
      std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator++(&__end2);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DebugInfoManager::AddDebugValueForVariable(Instruction* scope_and_line,
                                                uint32_t variable_id,
                                                uint32_t value_id,
                                                Instruction* insert_pos) {
  assert(scope_and_line != nullptr);

  auto dbg_decl_itr = var_id_to_dbg_decl_.find(variable_id);
  if (dbg_decl_itr == var_id_to_dbg_decl_.end()) return false;

  bool modified = false;
  for (auto* dbg_decl_or_val : dbg_decl_itr->second) {
    // Avoid inserting the new DebugValue between OpPhi or OpVariable
    // instructions.
    Instruction* insert_before = insert_pos->NextNode();
    while (insert_before->opcode() == spv::Op::OpPhi ||
           insert_before->opcode() == spv::Op::OpVariable) {
      insert_before = insert_before->NextNode();
    }
    modified |= AddDebugValueForDecl(dbg_decl_or_val, value_id, insert_before,
                                     scope_and_line) != nullptr;
  }
  return modified;
}